

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_test.cpp
# Opt level: O0

void testDefaultHelp_PrintToStream_ShouldSucceed(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  __type _Var1;
  string answer;
  stringstream ss;
  Argengine ae;
  size_type in_stack_fffffffffffffd08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  allocator_type *in_stack_fffffffffffffd38;
  allocator<char> *in_stack_fffffffffffffd40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  iterator in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  char *__lhs;
  string local_290 [56];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  stringstream local_1f8 [394];
  char local_6e [21];
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  size_type local_28;
  undefined1 local_20 [24];
  Argengine local_8 [8];
  
  local_6e[1] = 1;
  local_58 = &local_50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  local_6e[1] = 0;
  local_30 = &local_50;
  local_28 = 1;
  __lhs = local_6e;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x108474);
  __l._M_len = (size_type)in_stack_fffffffffffffd50;
  __l._M_array = in_stack_fffffffffffffd48;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffd40,__l,in_stack_fffffffffffffd38);
  juzzlin::Argengine::Argengine(local_8,local_20,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffd20);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x1084ce);
  pbVar2 = &local_50;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30;
  do {
    __rhs = __rhs + -1;
    std::__cxx11::string::~string((string *)__rhs);
  } while (__rhs != pbVar2);
  std::allocator<char>::~allocator(&local_59);
  std::__cxx11::stringstream::stringstream(local_1f8);
  juzzlin::Argengine::setOutputStream((ostream *)local_8);
  juzzlin::Argengine::printHelp();
  juzzlin::Argengine::arguments_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::at(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  std::operator+(__lhs,__rhs);
  std::operator+(in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
  std::operator+(in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
  std::__cxx11::string::~string(local_238);
  std::__cxx11::string::~string(local_258);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffd20);
  std::__cxx11::stringstream::str();
  _Var1 = std::operator==(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  if (!_Var1) {
    __assert_fail("ss.str() == answer",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/help_test/help_test.cpp"
                  ,0x4b,"void testDefaultHelp_PrintToStream_ShouldSucceed()");
  }
  std::__cxx11::string::~string(local_290);
  std::__cxx11::string::~string(local_218);
  std::__cxx11::stringstream::~stringstream(local_1f8);
  juzzlin::Argengine::~Argengine(local_8);
  return;
}

Assistant:

void testDefaultHelp_PrintToStream_ShouldSucceed()
{
    Argengine ae({ "test" });
    std::stringstream ss;
    ae.setOutputStream(ss);
    ae.printHelp();
    const std::string answer = "Usage: " + ae.arguments().at(0) + " [OPTIONS]\n\nOptions:\n\n" + //
      "-h, --help  Show this help.\n\n";
    assert(ss.str() == answer);
}